

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_modern_cpp.h
# Opt level: O2

row_iterator * __thiscall sqlite::row_iterator::operator++(row_iterator *this)

{
  undefined8 extraout_RAX;
  char *in_RCX;
  str_ref sql;
  int result;
  int local_2c;
  string local_28;
  
  local_2c = sqlite3_step((this->_binder->_stmt)._M_t.
                          super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t.
                          super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
                          super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl);
  if (local_2c == 0x65) {
    this->_binder = (database_binder *)0x0;
  }
  else {
    if (local_2c != 100) {
      database_binder::sql_abi_cxx11_(&local_28,this->_binder);
      sql._M_str = in_RCX;
      sql._M_len = (size_t)local_28._M_dataplus._M_p;
      errors::throw_sqlite_error((errors *)&local_2c,(int *)local_28._M_string_length,sql);
      std::__cxx11::string::~string((string *)&local_28);
      _Unwind_Resume(extraout_RAX);
    }
    (this->value)._binder = this->_binder;
    (this->value).next_index = 0;
  }
  return this;
}

Assistant:

row_iterator &operator++() {
			switch(int result = sqlite3_step(_binder->_stmt.get())) {
				case SQLITE_ROW:
					value = {_binder};
					break;
				case SQLITE_DONE:
					_binder = nullptr;
					break;
				default:
					exceptions::throw_sqlite_error(result, _binder->sql());
			}
			return *this;
		}